

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectionalAdapter.cpp
# Opt level: O1

DirectionalAtypeParameters * __thiscall
OpenMD::DirectionalAdapter::getDirectionalParam
          (DirectionalAtypeParameters *__return_storage_ptr__,DirectionalAdapter *this)

{
  bool bVar1;
  uint i;
  long lVar2;
  double (*padVar3) [3];
  uint j;
  long lVar4;
  double (*padVar5) [3];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<OpenMD::GenericData> data;
  undefined1 local_58 [16];
  string local_48;
  
  bVar1 = AtomType::hasProperty(this->at_,(string *)DirectionalTypeID_abi_cxx11_);
  if (!bVar1) {
    AtomType::getName_abi_cxx11_(&local_48,this->at_);
    snprintf(painCave.errMsg,2000,
             "DirectionalAdapter::getDirectionalParam was passed an atomType (%s)\n\tthat does not appear to be a Directional atom.\n"
             ,local_48._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  AtomType::getPropertyByName((AtomType *)local_58,(string *)this->at_);
  if ((_func_int **)local_58._0_8_ == (_func_int **)0x0) {
    AtomType::getName_abi_cxx11_(&local_48,this->at_);
    snprintf(painCave.errMsg,2000,
             "DirectionalAdapter::getDirectionalParam could not find Directional\n\tparameters for atomType %s.\n"
             ,local_48._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  if ((_func_int **)local_58._0_8_ == (_func_int **)0x0) {
    lVar2 = 0;
  }
  else {
    lVar2 = __dynamic_cast(local_58._0_8_,&GenericData::typeinfo,
                           &SimpleTypeData<OpenMD::DirectionalAtypeParameters>::typeinfo,0);
  }
  if (lVar2 == 0) {
    lVar2 = 0;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_58._8_8_ + 8) = *(_Atomic_word *)(local_58._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_58._8_8_ + 8) = *(_Atomic_word *)(local_58._8_8_ + 8) + 1;
      }
    }
  }
  if (lVar2 == 0) {
    AtomType::getName_abi_cxx11_(&local_48,this->at_);
    snprintf(painCave.errMsg,2000,
             "DirectionalAdapter::getDirectionalParam could not convert\n\tGenericData to DirectionalAtypeData for atom type %s\n"
             ,local_48._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  padVar5 = (double (*) [3])(lVar2 + 0x28);
  if ((DirectionalAtypeParameters *)padVar5 != __return_storage_ptr__) {
    lVar2 = 0;
    padVar3 = (double (*) [3])__return_storage_ptr__;
    do {
      lVar4 = 0;
      do {
        (((Mat3x3d *)*padVar3)->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
        data_[0][lVar4] =
             (((Mat3x3d *)*padVar5)->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>
             .data_[0][lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      lVar2 = lVar2 + 1;
      padVar3 = padVar3 + 1;
      padVar5 = padVar5 + 1;
    } while (lVar2 != 3);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

DirectionalAtypeParameters DirectionalAdapter::getDirectionalParam() {
    if (!isDirectional()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DirectionalAdapter::getDirectionalParam was passed an atomType "
               "(%s)\n"
               "\tthat does not appear to be a Directional atom.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<GenericData> data =
        at_->getPropertyByName(DirectionalTypeID);
    if (data == nullptr) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "DirectionalAdapter::getDirectionalParam could not find Directional\n"
          "\tparameters for atomType %s.\n",
          at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<DirectionalAtypeData> directionalData =
        std::dynamic_pointer_cast<DirectionalAtypeData>(data);
    if (directionalData == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DirectionalAdapter::getDirectionalParam could not convert\n"
               "\tGenericData to DirectionalAtypeData for atom type %s\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    return directionalData->getData();
  }